

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS
ref_cell_id_list_around_both
          (REF_CELL ref_cell_a,REF_CELL ref_cell_b,REF_INT node,REF_INT max_ids,REF_INT *n_ids,
          REF_INT *ids)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  REF_INT RVar8;
  uint uVar9;
  ulong uVar10;
  REF_INT nodes [27];
  
  *n_ids = 0;
  uVar10 = 0xffffffff;
  RVar8 = -1;
  if (-1 < node) {
    pRVar1 = ref_cell_a->ref_adj;
    uVar10 = 0xffffffff;
    RVar8 = -1;
    if (node < pRVar1->nnode) {
      uVar9 = pRVar1->first[(uint)node];
      uVar10 = 0xffffffff;
      RVar8 = -1;
      if ((long)(int)uVar9 != -1) {
        RVar8 = pRVar1->item[(int)uVar9].ref;
        uVar10 = (ulong)uVar9;
      }
    }
  }
  uVar9 = 0;
  do {
    if ((int)uVar10 == -1) {
      uVar10 = 0xffffffff;
      RVar8 = -1;
      if (-1 < node) {
        pRVar1 = ref_cell_b->ref_adj;
        uVar10 = 0xffffffff;
        RVar8 = -1;
        if (node < pRVar1->nnode) {
          uVar4 = pRVar1->first[(uint)node];
          uVar10 = 0xffffffff;
          RVar8 = -1;
          if ((long)(int)uVar4 != -1) {
            RVar8 = pRVar1->item[(int)uVar4].ref;
            uVar10 = (ulong)uVar4;
          }
        }
      }
      while( true ) {
        if ((int)uVar10 == -1) {
          return 0;
        }
        uVar4 = ref_cell_nodes(ref_cell_b,RVar8,nodes);
        if (uVar4 != 0) break;
        uVar5 = 0;
        uVar6 = 0;
        if (0 < (int)uVar9) {
          uVar6 = (ulong)uVar9;
        }
        bVar3 = false;
        for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          if (nodes[ref_cell_b->node_per] == ids[uVar5]) {
            bVar3 = true;
          }
        }
        if (!bVar3) {
          if (max_ids <= (int)uVar9) {
            return 7;
          }
          ids[(int)uVar9] = nodes[ref_cell_b->node_per];
          uVar9 = *n_ids + 1;
          *n_ids = uVar9;
        }
        pRVar2 = ref_cell_b->ref_adj->item;
        uVar10 = (ulong)pRVar2[(int)uVar10].next;
        RVar8 = -1;
        if (uVar10 != 0xffffffffffffffff) {
          RVar8 = pRVar2[uVar10].ref;
        }
      }
      uVar7 = 0x52a;
LAB_0011f02b:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar7,
             "ref_cell_id_list_around_both",(ulong)uVar4,"nodes");
      return uVar4;
    }
    uVar4 = ref_cell_nodes(ref_cell_a,RVar8,nodes);
    if (uVar4 != 0) {
      uVar7 = 0x51a;
      goto LAB_0011f02b;
    }
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar9) {
      uVar6 = (ulong)uVar9;
    }
    bVar3 = false;
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if (nodes[ref_cell_a->node_per] == ids[uVar5]) {
        bVar3 = true;
      }
    }
    if (!bVar3) {
      if (max_ids <= (int)uVar9) {
        return 7;
      }
      ids[(int)uVar9] = nodes[ref_cell_a->node_per];
      uVar9 = *n_ids + 1;
      *n_ids = uVar9;
    }
    pRVar2 = ref_cell_a->ref_adj->item;
    uVar10 = (ulong)pRVar2[(int)uVar10].next;
    RVar8 = -1;
    if (uVar10 != 0xffffffffffffffff) {
      RVar8 = pRVar2[uVar10].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_list_around_both(REF_CELL ref_cell_a,
                                                REF_CELL ref_cell_b,
                                                REF_INT node, REF_INT max_ids,
                                                REF_INT *n_ids, REF_INT *ids) {
  REF_INT item, cell, id, deg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL already_have_it;
  REF_CELL ref_cell;

  *n_ids = 0;

  ref_cell = ref_cell_a;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  ref_cell = ref_cell_b;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  return REF_SUCCESS;
}